

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O1

bool __thiscall testing::internal::DeathTestImpl::Passed(DeathTestImpl *this,bool status_ok)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  size_t sVar4;
  uint uVar5;
  char *pcVar6;
  ostream *poVar7;
  Message buffer;
  string error_message;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  string local_88;
  string local_68;
  string local_48;
  
  if (this->spawned_ != true) {
    return false;
  }
  GetCapturedStderr_abi_cxx11_();
  Message::Message((Message *)&local_90);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_90.ptr_ + 0x10),"Death test: ",0xc);
  pcVar6 = this->statement_;
  poVar7 = (ostream *)(local_90.ptr_ + 0x10);
  if (pcVar6 == (char *)0x0) {
    sVar4 = 6;
    pcVar6 = "(null)";
  }
  else {
    sVar4 = strlen(pcVar6);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar6,sVar4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_90.ptr_ + 0x10),"\n",1);
  switch(this->outcome_) {
  case DIED:
    if (status_ok) {
      bVar2 = RE::PartialMatch(local_48._M_dataplus._M_p,this->regex_);
      if (!bVar2) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_90.ptr_ + 0x10),
                   "    Result: died but not with expected error.\n",0x2e);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_90.ptr_ + 0x10),"  Expected: ",0xc);
        pcVar6 = *(char **)this->regex_;
        poVar7 = (ostream *)(local_90.ptr_ + 0x10);
        if (pcVar6 == (char *)0x0) {
          sVar4 = 6;
          pcVar6 = "(null)";
        }
        else {
          sVar4 = strlen(pcVar6);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar6,sVar4);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_90.ptr_ + 0x10),"\n",1)
        ;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_90.ptr_ + 0x10),"Actual msg:\n",0xc);
        FormatDeathTestOutput(&local_88,&local_48);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_90.ptr_ + 0x10),local_88._M_dataplus._M_p,
                   local_88._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
      }
      goto LAB_0011753b;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_90.ptr_ + 0x10),
               "    Result: died but not with expected exit code:\n",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_90.ptr_ + 0x10),"            ",0xc);
    uVar1 = this->status_;
    Message::Message((Message *)&local_68);
    uVar5 = uVar1 & 0x7f;
    if (uVar5 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_68._M_dataplus._M_p + 0x10),"Exited with exit status ",0x18);
      std::ostream::operator<<(local_68._M_dataplus._M_p + 0x10,uVar1 >> 8 & 0xff);
    }
    else if (0x1ffffff < (int)(uVar5 * 0x1000000 + 0x1000000)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_68._M_dataplus._M_p + 0x10),"Terminated by signal ",0x15);
      std::ostream::operator<<(local_68._M_dataplus._M_p + 0x10,uVar5);
    }
    if ((char)uVar1 < '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_68._M_dataplus._M_p + 0x10)," (core dumped)",0xe);
    }
    Message::GetString_abi_cxx11_(&local_88,(Message *)&local_68);
    if ((long *)local_68._M_dataplus._M_p != (long *)0x0) {
      bVar2 = IsTrue(true);
      if ((bVar2) && ((long *)local_68._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_68._M_dataplus._M_p + 8))();
      }
      local_68._M_dataplus._M_p = (pointer)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_90.ptr_ + 0x10),local_88._M_dataplus._M_p,local_88._M_string_length
              );
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_90.ptr_ + 0x10),"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_90.ptr_ + 0x10),"Actual msg:\n",0xc);
    FormatDeathTestOutput(&local_68,&local_48);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_90.ptr_ + 0x10),local_68._M_dataplus._M_p,local_68._M_string_length
              );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    break;
  case LIVED:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_90.ptr_ + 0x10),"    Result: failed to die.\n",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_90.ptr_ + 0x10)," Error msg:\n",0xc);
    FormatDeathTestOutput(&local_88,&local_48);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_90.ptr_ + 0x10),local_88._M_dataplus._M_p,local_88._M_string_length
              );
    break;
  case RETURNED:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_90.ptr_ + 0x10),"    Result: illegal return in test statement.\n",
               0x2e);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_90.ptr_ + 0x10)," Error msg:\n",0xc);
    FormatDeathTestOutput(&local_88,&local_48);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_90.ptr_ + 0x10),local_88._M_dataplus._M_p,local_88._M_string_length
              );
    break;
  case THREW:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_90.ptr_ + 0x10),"    Result: threw an exception.\n",0x20);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_90.ptr_ + 0x10)," Error msg:\n",0xc);
    FormatDeathTestOutput(&local_88,&local_48);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_90.ptr_ + 0x10),local_88._M_dataplus._M_p,local_88._M_string_length
              );
    break;
  default:
    GTestLog::GTestLog((GTestLog *)&local_88,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/contrib/gtest-1.7.0/src/gtest-death-test.cc"
                       ,0x23b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DeathTest::Passed somehow called before conclusion of test",
               0x3a);
    GTestLog::~GTestLog((GTestLog *)&local_88);
    goto LAB_00117539;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
LAB_00117539:
  bVar2 = false;
LAB_0011753b:
  Message::GetString_abi_cxx11_(&local_88,(Message *)&local_90);
  std::__cxx11::string::_M_assign((string *)&DeathTest::last_death_test_message__abi_cxx11_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if (local_90.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar3 = IsTrue(true);
    if ((bVar3) &&
       (local_90.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_90.ptr_ + 8))();
    }
    local_90.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return bVar2;
}

Assistant:

bool DeathTestImpl::Passed(bool status_ok) {
  if (!spawned())
    return false;

  const std::string error_message = GetCapturedStderr();

  bool success = false;
  Message buffer;

  buffer << "Death test: " << statement() << "\n";
  switch (outcome()) {
    case LIVED:
      buffer << "    Result: failed to die.\n"
             << " Error msg:\n" << FormatDeathTestOutput(error_message);
      break;
    case THREW:
      buffer << "    Result: threw an exception.\n"
             << " Error msg:\n" << FormatDeathTestOutput(error_message);
      break;
    case RETURNED:
      buffer << "    Result: illegal return in test statement.\n"
             << " Error msg:\n" << FormatDeathTestOutput(error_message);
      break;
    case DIED:
      if (status_ok) {
        const bool matched = RE::PartialMatch(error_message.c_str(), *regex());
        if (matched) {
          success = true;
        } else {
          buffer << "    Result: died but not with expected error.\n"
                 << "  Expected: " << regex()->pattern() << "\n"
                 << "Actual msg:\n" << FormatDeathTestOutput(error_message);
        }
      } else {
        buffer << "    Result: died but not with expected exit code:\n"
               << "            " << ExitSummary(status()) << "\n"
               << "Actual msg:\n" << FormatDeathTestOutput(error_message);
      }
      break;
    case IN_PROGRESS:
    default:
      GTEST_LOG_(FATAL)
          << "DeathTest::Passed somehow called before conclusion of test";
  }

  DeathTest::set_last_death_test_message(buffer.GetString());
  return success;
}